

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cache.cpp
# Opt level: O1

double log2(double __x)

{
  bool bVar1;
  ulong uVar2;
  uint in_EDI;
  
  if (in_EDI != 1) {
    if (in_EDI == 0) {
      log2();
    }
    uVar2 = (ulong)in_EDI;
    do {
      uVar2 = uVar2 >> 1;
      bVar1 = 3 < in_EDI;
      in_EDI = (uint)uVar2;
    } while (bVar1);
  }
  return __x;
}

Assistant:

uint32_t log2(uint32_t val) {
    if (val == 0) {
        fprintf(stderr, "log2 0, invalid!\n");
        exit(-1);
    }
    uint32_t res = 0;
    while (val > 1) {
        val >>= 1;
        res++;
    }
    return res;
}